

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O3

bool __thiscall
InliningDecider::CanRecursivelyInline
          (InliningDecider *this,FunctionBody *inlinee,FunctionBody *inliner,
          bool allowRecursiveInlining,uint recursiveInlineDepth)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  undefined4 extraout_var_00;
  char16 *pcVar9;
  FunctionInfo *pFVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar11;
  uint uVar12;
  wchar local_f8 [4];
  char16 debugStringBuffer [42];
  wchar local_98 [4];
  char16 debugStringBuffer2 [42];
  
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  pFVar10 = (inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar10 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    unique0x1000051d = inlinee;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0055f19d;
    *puVar7 = 0;
    pFVar10 = (inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    inlinee = stack0xffffffffffffffc0;
  }
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,InlineRecursivePhase,uVar4,pFVar10->functionId);
  if ((((inlinee != inliner) || (bVar3)) || (!allowRecursiveInlining)) ||
     (bVar3 = Js::FunctionBody::CanInlineRecursively(inlinee,recursiveInlineDepth,true), !bVar3)) {
    uVar12 = 0xff;
    if ((int)DAT_015a1ef8 < 0xff) {
      uVar12 = DAT_015a1ef8;
    }
    uVar11 = 1;
    if (1 < (int)uVar12) {
      uVar11 = uVar12;
    }
    if (inlinee->inlineDepth < uVar11) {
      return true;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    pFVar1 = this->topFunc;
    pFVar10 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_0055f19d;
      *puVar7 = 0;
      pFVar10 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,pFVar10->functionId);
    if (!bVar3) {
      return false;
    }
    iVar5 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    pcVar8 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)inlinee,(wchar (*) [42])local_f8)
    ;
    iVar6 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)inliner,(wchar (*) [42])local_98)
    ;
    bVar3 = false;
    Output::Print(L"INLINING: Skip Inline: Do not inline recursive functions\tInlinee: %s (%s)\tCaller: %s (%s)\n"
                  ,CONCAT44(extraout_var_01,iVar5),pcVar8,CONCAT44(extraout_var_02,iVar6),pcVar9);
  }
  else {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    pFVar1 = this->topFunc;
    pFVar10 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
LAB_0055f19d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      pFVar10 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,pFVar10->functionId);
    if (!bVar3) {
      return true;
    }
    iVar5 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    pcVar8 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)inlinee,(wchar (*) [42])local_f8)
    ;
    iVar6 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)inliner,(wchar (*) [42])local_98)
    ;
    Output::Print(L"INLINING: Inlined recursively\tInlinee: %s (%s)\tCaller: %s (%s)\tDepth: %d\n",
                  CONCAT44(extraout_var,iVar5),pcVar8,CONCAT44(extraout_var_00,iVar6),pcVar9,
                  (ulong)recursiveInlineDepth);
    bVar3 = true;
  }
  Output::Flush();
  return bVar3;
}

Assistant:

bool InliningDecider::CanRecursivelyInline(Js::FunctionBody * inlinee, Js::FunctionBody *inliner, bool allowRecursiveInlining, uint recursiveInlineDepth)
{
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif


    if (!PHASE_OFF(Js::InlineRecursivePhase, inliner)
        && allowRecursiveInlining
        &&  inlinee == inliner
        &&  inlinee->CanInlineRecursively(recursiveInlineDepth))
    {
        INLINE_TESTTRACE(_u("INLINING: Inlined recursively\tInlinee: %s (%s)\tCaller: %s (%s)\tDepth: %d\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2), recursiveInlineDepth);
        return true;
    }

    if (!inlinee->CanInlineAgain())
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Do not inline recursive functions\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2));
        return false;
    }

    return true;
}